

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Type TVar4;
  Descriptor *pDVar5;
  LogMessage *pLVar6;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Descriptor *local_38;
  Descriptor *desc_local;
  int ctype_local;
  CppType cpptype_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_38 = desc;
  desc_local._0_4_ = ctype;
  desc_local._4_4_ = cpptype;
  _ctype_local = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  anon_unknown_0::CheckInvalidAccess(&this->schema_,_ctype_local);
  CVar3 = FieldDescriptor::cpp_type(_ctype_local);
  if ((CVar3 != desc_local._4_4_) &&
     ((CVar3 = FieldDescriptor::cpp_type(_ctype_local), CVar3 != CPPTYPE_ENUM ||
      (desc_local._4_4_ != CPPTYPE_INT32)))) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,_ctype_local,"MutableRawRepeatedField",desc_local._4_4_);
  }
  if (local_38 != (Descriptor *)0x0) {
    pDVar5 = FieldDescriptor::message_type(_ctype_local);
    local_71 = 0;
    if (pDVar5 != local_38) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x8d1);
      local_71 = 1;
      pLVar6 = internal::LogMessage::operator<<
                         (&local_70,"CHECK failed: (field->message_type()) == (desc): ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"wrong submessage type");
      internal::LogFinisher::operator=(local_85,pLVar6);
    }
    if ((local_71 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_70);
    }
  }
  bVar1 = FieldDescriptor::is_extension(_ctype_local);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(_ctype_local);
    TVar4 = FieldDescriptor::type(_ctype_local);
    bVar1 = FieldDescriptor::is_packed(_ctype_local);
    this_local = (Reflection *)
                 internal::ExtensionSet::MutableRawRepeatedField
                           (this_00,number,(FieldType)TVar4,bVar1,_ctype_local);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi(_ctype_local);
    if (bVar1) {
      this_01 = MutableRawNonOneof<google::protobuf::internal::MapFieldBase>
                          (this,(Message *)field_local,_ctype_local);
      this_local = (Reflection *)internal::MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      this_local = (Reflection *)MutableRawNonOneof<void>(this,(Message *)field_local,_ctype_local);
    }
  }
  return this_local;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  CheckInvalidAccess(schema_, field);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}